

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall
cmCTestSubmitHandler::SelectParts
          (cmCTestSubmitHandler *this,
          set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *parts)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  key_type local_1c;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *psStack_18;
  Part p;
  set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *parts_local;
  cmCTestSubmitHandler *this_local;
  
  psStack_18 = parts;
  parts_local = (set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *)this
  ;
  for (local_1c = PartStart; local_1c != PartCount; local_1c = local_1c + PartUpdate) {
    local_28._M_node =
         (_Base_ptr)
         std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::find
                   (psStack_18,&local_1c);
    local_30._M_node =
         (_Base_ptr)
         std::set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>::end
                   (psStack_18);
    bVar1 = std::operator!=(&local_28,&local_30);
    this->SubmitPart[local_1c] = bVar1;
  }
  return;
}

Assistant:

void cmCTestSubmitHandler::SelectParts(std::set<cmCTest::Part> const& parts)
{
  // Check whether each part is selected.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    this->SubmitPart[p] = parts.find(p) != parts.end();
  }
}